

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_downscaleStat(uint *table,U32 lastEltIndex,int malus)

{
  U32 local_20;
  uint local_1c;
  U32 sum;
  U32 s;
  int malus_local;
  U32 lastEltIndex_local;
  uint *table_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < lastEltIndex + 1; local_1c = local_1c + 1) {
    table[local_1c] = (table[local_1c] >> ((char)malus + 4U & 0x1f)) + 1;
    local_20 = table[local_1c] + local_20;
  }
  return local_20;
}

Assistant:

static U32 ZSTD_downscaleStat(unsigned* table, U32 lastEltIndex, int malus)
{
    U32 s, sum=0;
    DEBUGLOG(5, "ZSTD_downscaleStat (nbElts=%u)", (unsigned)lastEltIndex+1);
    assert(ZSTD_FREQ_DIV+malus > 0 && ZSTD_FREQ_DIV+malus < 31);
    for (s=0; s<lastEltIndex+1; s++) {
        table[s] = 1 + (table[s] >> (ZSTD_FREQ_DIV+malus));
        sum += table[s];
    }
    return sum;
}